

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ArrayBuffer.cpp
# Opt level: O1

void __thiscall
Js::ArrayBuffer::ArrayBuffer<void*(*)(unsigned_long)>
          (ArrayBuffer *this,uint32 length,DynamicType *type,_func_void_ptr_unsigned_long *allocator
          )

{
  Recycler *this_00;
  bool bVar1;
  Type __s;
  HeapAllocator *alloc;
  Type pRVar2;
  ulong size;
  undefined1 local_60 [8];
  TrackAllocData data;
  
  DynamicObject::DynamicObject((DynamicObject *)this,type,true);
  (this->super_ArrayBufferBase).isDetached = false;
  (this->super_ArrayBufferBase).externalized = false;
  (this->super_ArrayBufferBase).infoBits = '\0';
  (this->super_ArrayBufferBase).super_DynamicObject.super_RecyclableObject.super_FinalizableObject.
  super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject = (_func_int **)&PTR_Finalize_01505ca8;
  (this->primaryParent).ptr = (RecyclerWeakReference<Js::ArrayBufferParent> *)0x0;
  (this->otherParents).ptr = (OtherParents *)0x0;
  *(undefined8 *)((long)&(this->otherParents).ptr + 4) = 0;
  *(undefined8 *)((long)&this->bufferContent + 4) = 0;
  if ((int)length < 0) {
    JavascriptError::ThrowTypeError
              ((((((this->super_ArrayBufferBase).super_DynamicObject.super_RecyclableObject.type.ptr
                  )->javascriptLibrary).ptr)->super_JavascriptLibraryBase).scriptContext.ptr,
               -0x7ff5ec37,(PCWSTR)0x0);
  }
  if (length == 0) {
    return;
  }
  this_00 = ((((this->super_ArrayBufferBase).super_DynamicObject.super_RecyclableObject.type.ptr)->
             javascriptLibrary).ptr)->recycler;
  size = (ulong)length;
  bVar1 = Memory::Recycler::RequestExternalMemoryAllocation(this_00,size);
  data._32_8_ = allocator;
  if (bVar1) {
    __s = (Type)(*allocator)(size);
    if (__s == (Type)0x0) {
      Memory::Recycler::ReportExternalMemoryFree(this_00,size);
      goto LAB_00b3158d;
    }
  }
  else {
LAB_00b3158d:
    __s = (Type)0x0;
  }
  if (__s == (Type)0x0) {
    Memory::Recycler::CollectNow<(Memory::CollectionFlags)404852739>(this_00);
    bVar1 = Memory::Recycler::RequestExternalMemoryAllocation(this_00,size);
    if (bVar1) {
      __s = (Type)(*(code *)data._32_8_)(size);
      if (__s != (Type)0x0) goto LAB_00b315c8;
      Memory::Recycler::ReportExternalMemoryFailure(this_00,size);
    }
    __s = (Type)0x0;
  }
LAB_00b315c8:
  if (__s != (Type)0x0) {
    this->bufferLength = length;
    memset(__s,0,size);
    local_60 = (undefined1  [8])&RefCountedBuffer::typeinfo;
    data.typeinfo = (type_info *)0x0;
    data.plusSize = 0xffffffffffffffff;
    data.count = (size_t)anon_var_dwarf_5dbadfc;
    data.filename._0_4_ = 0x2b4;
    alloc = Memory::HeapAllocator::TrackAllocInfo
                      (&Memory::HeapAllocator::Instance,(TrackAllocData *)local_60);
    pRVar2 = (Type)new<Memory::HeapAllocator>(0x10,alloc,0x300d4a);
    pRVar2->buffer = __s;
    pRVar2->refCount = 1;
    this->bufferContent = pRVar2;
    return;
  }
  JavascriptError::ThrowOutOfMemoryError
            ((((((this->super_ArrayBufferBase).super_DynamicObject.super_RecyclableObject.type.ptr)
               ->javascriptLibrary).ptr)->super_JavascriptLibraryBase).scriptContext.ptr);
}

Assistant:

ArrayBuffer::ArrayBuffer(uint32 length, DynamicType * type, Allocator allocator) :
        ArrayBufferBase(type), bufferContent(nullptr), bufferLength(0)
    {
        if (length > MaxArrayBufferLength)
        {
            JavascriptError::ThrowTypeError(GetScriptContext(), JSERR_FunctionArgument_Invalid);
        }
        else if (length > 0)
        {
            BYTE * buffer = nullptr;
            Recycler* recycler = GetType()->GetLibrary()->GetRecycler();
            if (recycler->RequestExternalMemoryAllocation(length))
            {
                buffer = (BYTE*)allocator(length);
                if (buffer == nullptr)
                {
                    recycler->ReportExternalMemoryFree(length);
                }
            }

            if (buffer == nullptr)
            {
                recycler->CollectNow<CollectOnTypedArrayAllocation>();

                if (recycler->RequestExternalMemoryAllocation(length))
                {
                    buffer = (BYTE*)allocator(length);
                    if (buffer == nullptr)
                    {
                        recycler->ReportExternalMemoryFailure(length);
                    }
                }
            }

            if (buffer == nullptr)
            {
                JavascriptError::ThrowOutOfMemoryError(GetScriptContext());
            }
            else
            {
                bufferLength = length;
                ZeroMemory(buffer, bufferLength);
                RefCountedBuffer* localContent = HeapNew(RefCountedBuffer, buffer);
                this->bufferContent = localContent;
            }
        }
    }